

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool __thiscall Datetime::parse_weekday(Datetime *this,Pig *pig,int *value)

{
  bool bVar1;
  int iVar2;
  int local_34;
  size_type sStack_30;
  int weekday;
  size_type checkpoint;
  int *value_local;
  Pig *pig_local;
  Datetime *this_local;
  
  checkpoint = (size_type)value;
  value_local = (int *)pig;
  pig_local = (Pig *)this;
  sStack_30 = Pig::cursor(pig);
  bVar1 = Pig::getDigit((Pig *)value_local,&local_34);
  if ((bVar1) && (weekstart <= local_34)) {
    iVar2 = 6;
    if (weekstart == 1) {
      iVar2 = 7;
    }
    if (local_34 <= iVar2) {
      *(int *)checkpoint = local_34;
      return true;
    }
  }
  Pig::restoreTo((Pig *)value_local,sStack_30);
  return false;
}

Assistant:

bool Datetime::parse_weekday (Pig& pig, int& value)
{
  auto checkpoint = pig.cursor ();

  int weekday;
  if (pig.getDigit (weekday) &&
      weekday >= Datetime::weekstart &&
      weekday <= (Datetime::weekstart == 1 ? 7 : 6))
  {
    value = weekday;
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}